

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaReadAig.c
# Opt level: O1

Aig_Man_t * Ioa_ReadAigerFromMemory(char *pContents,int nFileSize,int fCheck)

{
  byte bVar1;
  byte bVar2;
  Aig_Man_t *p;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  uint *__ptr;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint *puVar13;
  ulong uVar14;
  byte *pbVar15;
  byte *pbVar16;
  size_t __size;
  long lVar17;
  char *pcVar18;
  Vec_Int_t *p_00;
  uint uVar19;
  byte *pbVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  byte *local_98;
  uint *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  Aig_Man_t *local_68;
  Vec_Int_t *local_60;
  uint local_54;
  char *local_50;
  uint local_48;
  int local_44;
  uint local_40;
  int local_3c;
  Aig_Obj_t *local_38;
  
  iVar3 = strncmp(pContents,"aig",3);
  if ((iVar3 == 0) && ((pbVar20 = (byte *)pContents, pContents[3] == '2' || (pContents[3] == ' '))))
  {
    do {
      bVar1 = *pbVar20;
      pbVar20 = pbVar20 + 1;
    } while (bVar1 != 0x20);
    local_98 = pbVar20;
    iVar3 = atoi((char *)pbVar20);
    do {
      bVar1 = *pbVar20;
      pbVar20 = pbVar20 + 1;
    } while (bVar1 != 0x20);
    local_98 = pbVar20;
    iVar4 = atoi((char *)pbVar20);
    local_88 = CONCAT44(extraout_var,iVar4);
    do {
      bVar1 = *pbVar20;
      pbVar20 = pbVar20 + 1;
    } while (bVar1 != 0x20);
    local_98 = pbVar20;
    iVar4 = atoi((char *)pbVar20);
    local_80 = CONCAT44(extraout_var_00,iVar4);
    do {
      bVar1 = *pbVar20;
      pbVar20 = pbVar20 + 1;
    } while (bVar1 != 0x20);
    local_98 = pbVar20;
    uVar5 = atoi((char *)pbVar20);
    do {
      bVar1 = *pbVar20;
      pbVar20 = pbVar20 + 1;
    } while (bVar1 != 0x20);
    local_98 = pbVar20;
    iVar4 = atoi((char *)pbVar20);
    local_78 = CONCAT44(extraout_var_01,iVar4);
LAB_00744385:
    local_98 = pbVar20;
    if (*pbVar20 == 10) {
      local_54 = 0;
    }
    else {
      if (*pbVar20 != 0x20) goto code_r0x00744393;
      if (uVar5 != 0) {
        __assert_fail("nOutputs == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ioa/ioaReadAig.c"
                      ,0x89,"Aig_Man_t *Ioa_ReadAigerFromMemory(char *, int, int)");
      }
      pbVar20 = pbVar20 + 1;
      local_98 = pbVar20;
      uVar5 = atoi((char *)pbVar20);
      for (; (*pbVar20 != 10 && (*pbVar20 != 0x20)); pbVar20 = pbVar20 + 1) {
      }
      local_54 = (uint)(uVar5 != 0);
      local_98 = pbVar20;
    }
    uVar6 = 0;
    if (*local_98 == 0x20) {
      pbVar20 = local_98 + 1;
      local_98 = pbVar20;
      uVar6 = atoi((char *)pbVar20);
      for (; (*pbVar20 != 10 && (*pbVar20 != 0x20)); pbVar20 = pbVar20 + 1) {
      }
      uVar5 = uVar6 + uVar5;
      local_98 = pbVar20;
    }
    local_50 = pContents;
    local_3c = nFileSize;
    if (*local_98 == 0x20) {
      pbVar20 = local_98 + 1;
      local_98 = pbVar20;
      iVar4 = atoi((char *)pbVar20);
      for (; (*pbVar20 != 10 && (*pbVar20 != 0x20)); pbVar20 = pbVar20 + 1) {
      }
      uVar5 = uVar5 + iVar4;
      bVar23 = iVar4 != 0;
      local_98 = pbVar20;
    }
    else {
      bVar23 = false;
    }
    if (*local_98 == 0x20) {
      pbVar20 = local_98 + 1;
      local_98 = pbVar20;
      iVar4 = atoi((char *)pbVar20);
      for (; (*pbVar20 != 10 && (*pbVar20 != 0x20)); pbVar20 = pbVar20 + 1) {
      }
      uVar5 = uVar5 + iVar4;
      bVar24 = iVar4 != 0;
      local_98 = pbVar20;
    }
    else {
      bVar24 = false;
    }
    uVar21 = (ulong)uVar5;
    if (*local_98 == 10) {
      pbVar20 = local_98 + 1;
      iVar4 = (int)local_80 + (int)local_88;
      local_98 = pbVar20;
      local_70 = uVar21;
      if (iVar3 == (int)local_78 + iVar4) {
        if (!(bool)(bVar23 | bVar24)) {
          if (uVar6 != 0) {
            if (uVar6 == 1) {
              fwrite("Warning: The last output is interpreted as a constraint.\n",0x39,1,_stdout);
            }
            else {
              fprintf(_stdout,"Warning: The last %d outputs are interpreted as constraints.\n",
                      (ulong)uVar6);
            }
          }
          iVar3 = (int)local_78;
          local_68 = Aig_ManStart(iVar3);
          local_68->nConstrs = uVar6;
          uVar7 = (int)local_88 + (int)local_80;
          local_88 = (ulong)uVar7;
          local_48 = uVar6;
          local_90 = (uint *)malloc(0x10);
          uVar5 = 8;
          if (6 < uVar7 + iVar3) {
            uVar5 = iVar3 + uVar7 + 1;
          }
          local_90[1] = 0;
          *local_90 = uVar5;
          if (uVar5 == 0) {
            pvVar8 = (void *)0x0;
          }
          else {
            pvVar8 = malloc((long)(int)uVar5 << 3);
          }
          pcVar18 = local_50;
          *(void **)(local_90 + 2) = pvVar8;
          pAVar9 = local_68->pConst1;
          if (uVar5 == 0) {
            if (pvVar8 == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(pvVar8,0x80);
            }
            *(void **)(local_90 + 2) = pvVar8;
            *local_90 = 0x10;
          }
          local_90[1] = 1;
          **(ulong **)(local_90 + 2) = (ulong)pAVar9 ^ 1;
          local_44 = fCheck;
          if (0 < iVar4) {
            do {
              pAVar9 = Aig_ObjCreateCi(local_68);
              uVar5 = local_90[1];
              uVar6 = *local_90;
              if (uVar5 == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (*(void **)(local_90 + 2) == (void *)0x0) {
                    pvVar8 = malloc(0x80);
                  }
                  else {
                    pvVar8 = realloc(*(void **)(local_90 + 2),0x80);
                  }
                  uVar7 = 0x10;
                }
                else {
                  uVar7 = uVar6 * 2;
                  if ((int)uVar7 <= (int)uVar6) goto LAB_007446d0;
                  if (*(void **)(local_90 + 2) == (void *)0x0) {
                    pvVar8 = malloc((ulong)uVar6 << 4);
                  }
                  else {
                    pvVar8 = realloc(*(void **)(local_90 + 2),(ulong)uVar6 << 4);
                  }
                }
                *(void **)(local_90 + 2) = pvVar8;
                *local_90 = uVar7;
              }
LAB_007446d0:
              local_90[1] = uVar5 + 1;
              *(Aig_Obj_t **)(*(long *)(local_90 + 2) + (long)(int)uVar5 * 8) = pAVar9;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          local_68->nRegs = (int)local_80;
          local_40 = (int)local_70 + (int)local_80;
          if (pcVar18[3] == ' ') {
            if (0 < (int)local_40) {
              iVar3 = 0;
              pbVar16 = local_98;
              do {
                local_98 = pbVar16 + 1;
                iVar3 = iVar3 + (uint)(*pbVar16 == 10);
                pbVar16 = local_98;
              } while (iVar3 < (int)local_40);
            }
            local_60 = (Vec_Int_t *)0x0;
          }
          else {
            local_60 = Ioa_WriteDecodeLiterals((char **)&local_98,local_40);
          }
          pbVar16 = local_98;
          if (0 < (int)local_78) {
            iVar3 = 0;
            lVar17 = (long)(int)local_90[1];
            do {
              bVar1 = *pbVar16;
              bVar10 = 0;
              uVar5 = 0;
              while( true ) {
                pbVar15 = pbVar16 + 1;
                if (-1 < (char)bVar1) break;
                uVar5 = uVar5 | (bVar1 & 0x7f) << (bVar10 & 0x1f);
                bVar1 = *pbVar15;
                bVar10 = bVar10 + 7;
                pbVar16 = pbVar15;
              }
              uVar6 = (uint)*pbVar15;
              pbVar16 = pbVar16 + 2;
              bVar11 = 0;
              if ((char)*pbVar15 < '\0') {
                bVar11 = 0;
                uVar7 = 0;
                do {
                  uVar7 = uVar7 | (uVar6 & 0x7f) << (bVar11 & 0x1f);
                  bVar2 = *pbVar16;
                  uVar6 = (uint)bVar2;
                  pbVar16 = pbVar16 + 1;
                  bVar11 = bVar11 + 7;
                } while ((char)bVar2 < '\0');
              }
              else {
                uVar7 = 0;
              }
              uVar19 = (int)local_88 + iVar3 + 1;
              uVar12 = uVar19 * 2 - ((uint)bVar1 << (bVar10 & 0x1f) | uVar5);
              uVar6 = uVar12 - (uVar6 << (bVar11 & 0x1f) | uVar7);
              uVar5 = uVar6 >> 1;
              pbVar15 = pbVar16;
              if ((lVar17 <= (long)(ulong)uVar5) || (lVar17 <= (long)(ulong)(uVar12 >> 1)))
              goto LAB_00744ea3;
              if (uVar19 != (uint)lVar17) {
                local_98 = pbVar16;
                __assert_fail("Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ioa/ioaReadAig.c"
                              ,0x100,"Aig_Man_t *Ioa_ReadAigerFromMemory(char *, int, int)");
              }
              pvVar8 = *(void **)(local_90 + 2);
              pAVar9 = Aig_And(local_68,(Aig_Obj_t *)
                                        ((ulong)(uVar6 & 1) ^
                                        *(ulong *)((long)pvVar8 + (ulong)uVar5 * 8)),
                               (Aig_Obj_t *)
                               ((ulong)(uVar12 & 1) ^
                               *(ulong *)((long)pvVar8 + (ulong)(uVar12 >> 1) * 8)));
              uVar5 = *local_90;
              if (uVar5 == (uint)lVar17) {
                if ((int)uVar5 < 0x10) {
                  if (pvVar8 == (void *)0x0) {
                    local_38 = pAVar9;
                    pvVar8 = malloc(0x80);
                  }
                  else {
                    local_38 = pAVar9;
                    pvVar8 = realloc(pvVar8,0x80);
                  }
                  uVar6 = 0x10;
                }
                else {
                  uVar6 = uVar5 * 2;
                  if ((int)uVar6 <= (int)uVar5) goto LAB_00744889;
                  if (pvVar8 == (void *)0x0) {
                    local_38 = pAVar9;
                    pvVar8 = malloc((ulong)uVar5 << 4);
                  }
                  else {
                    local_38 = pAVar9;
                    pvVar8 = realloc(pvVar8,(ulong)uVar5 << 4);
                  }
                }
                *(void **)(local_90 + 2) = pvVar8;
                *local_90 = uVar6;
                pAVar9 = local_38;
              }
LAB_00744889:
              iVar3 = iVar3 + 1;
              local_90[1] = (uint)(lVar17 + 1);
              *(Aig_Obj_t **)(*(long *)(local_90 + 2) + lVar17 * 8) = pAVar9;
              lVar17 = lVar17 + 1;
            } while (iVar3 != (int)local_78);
          }
          local_98 = pbVar16;
          __ptr = (uint *)malloc(0x10);
          uVar21 = local_70;
          uVar5 = local_40;
          if (((int)local_80 + (int)local_70) - 1U < 7) {
            uVar5 = 8;
          }
          __ptr[1] = 0;
          *__ptr = uVar5;
          if (uVar5 == 0) {
            pvVar8 = (void *)0x0;
          }
          else {
            pvVar8 = malloc((long)(int)uVar5 << 3);
          }
          *(void **)(__ptr + 2) = pvVar8;
          if (local_50[3] == ' ') {
            if (0 < (int)local_80) {
              local_88 = CONCAT44(local_88._4_4_,local_90[1]);
              iVar3 = 0;
              local_98 = pbVar20;
              do {
                uVar5 = atoi((char *)pbVar20);
                do {
                  bVar1 = *pbVar20;
                  pbVar20 = pbVar20 + 1;
                } while (bVar1 != 10);
                pbVar15 = pbVar20;
                if ((int)local_88 <= (int)(uVar5 >> 1)) goto LAB_00744ea3;
                uVar21 = *(ulong *)(*(long *)(local_90 + 2) + (ulong)(uVar5 >> 1) * 8);
                lVar17 = (long)(int)__ptr[1];
                uVar6 = *__ptr;
                if (__ptr[1] == uVar6) {
                  if ((int)uVar6 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      local_78 = lVar17;
                      pvVar8 = malloc(0x80);
                    }
                    else {
                      local_78 = lVar17;
                      pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    uVar7 = 0x10;
                  }
                  else {
                    uVar7 = uVar6 * 2;
                    if ((int)uVar7 <= (int)uVar6) goto LAB_007449e0;
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      local_78 = lVar17;
                      pvVar8 = malloc((ulong)uVar6 << 4);
                    }
                    else {
                      local_78 = lVar17;
                      pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar6 << 4);
                    }
                  }
                  *(void **)(__ptr + 2) = pvVar8;
                  *__ptr = uVar7;
                  lVar17 = local_78;
                }
LAB_007449e0:
                __ptr[1] = (int)lVar17 + 1;
                *(ulong *)(*(long *)(__ptr + 2) + lVar17 * 8) = uVar5 & 1 ^ uVar21;
                iVar3 = iVar3 + 1;
              } while (iVar3 != (int)local_80);
            }
            if (0 < (int)local_70) {
              local_88 = CONCAT44(local_88._4_4_,local_90[1]);
              iVar3 = 0;
              local_98 = pbVar20;
              do {
                uVar5 = atoi((char *)pbVar20);
                do {
                  bVar1 = *pbVar20;
                  pbVar20 = pbVar20 + 1;
                } while (bVar1 != 10);
                pbVar15 = pbVar20;
                if ((int)local_88 <= (int)(uVar5 >> 1)) goto LAB_00744ea3;
                uVar21 = *(ulong *)(*(long *)(local_90 + 2) + (ulong)(uVar5 >> 1) * 8);
                lVar17 = (long)(int)__ptr[1];
                uVar6 = *__ptr;
                if (__ptr[1] == uVar6) {
                  if ((int)uVar6 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      local_78 = lVar17;
                      pvVar8 = malloc(0x80);
                    }
                    else {
                      local_78 = lVar17;
                      pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    uVar7 = 0x10;
                  }
                  else {
                    uVar7 = uVar6 * 2;
                    if ((int)uVar7 <= (int)uVar6) goto LAB_00744bac;
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      local_78 = lVar17;
                      pvVar8 = malloc((ulong)uVar6 << 4);
                    }
                    else {
                      local_78 = lVar17;
                      pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar6 << 4);
                    }
                  }
                  *(void **)(__ptr + 2) = pvVar8;
                  *__ptr = uVar7;
                  lVar17 = local_78;
                }
LAB_00744bac:
                __ptr[1] = (int)lVar17 + 1;
                *(ulong *)(*(long *)(__ptr + 2) + lVar17 * 8) = uVar5 & 1 ^ uVar21;
                iVar3 = iVar3 + 1;
              } while (iVar3 != (int)local_70);
            }
            uVar5 = (uint)local_70;
            uVar21 = local_80;
            local_98 = pbVar20;
          }
          else {
            puVar13 = local_90;
            p_00 = local_60;
            if (0 < (int)local_80) {
              uVar14 = local_80 & 0xffffffff;
              uVar22 = 0;
              local_88 = uVar14;
              do {
                if ((long)p_00->nSize <= (long)uVar22) goto LAB_00744e5d;
                uVar5 = p_00->pArray[uVar22];
                uVar6 = uVar5 >> 1;
                pbVar15 = local_98;
                if ((int)puVar13[1] <= (int)uVar6) goto LAB_00744ea3;
                uVar21 = *(ulong *)(*(long *)(puVar13 + 2) + (ulong)uVar6 * 8);
                uVar6 = __ptr[1];
                uVar7 = *__ptr;
                if (uVar6 == uVar7) {
                  if ((int)uVar7 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar8 = malloc(0x80);
                    }
                    else {
                      pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    uVar12 = 0x10;
                  }
                  else {
                    uVar12 = uVar7 * 2;
                    if ((int)uVar12 <= (int)uVar7) goto LAB_00744abf;
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar8 = malloc((ulong)uVar7 << 4);
                    }
                    else {
                      pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar7 << 4);
                    }
                  }
                  *(void **)(__ptr + 2) = pvVar8;
                  *__ptr = uVar12;
                  puVar13 = local_90;
                  uVar14 = local_88;
                  p_00 = local_60;
                }
LAB_00744abf:
                __ptr[1] = uVar6 + 1;
                *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar6 * 8) = uVar5 & 1 ^ uVar21;
                uVar22 = uVar22 + 1;
                uVar21 = local_70;
              } while (uVar14 != uVar22);
            }
            uVar5 = (uint)uVar21;
            if (0 < (int)uVar5) {
              lVar17 = (long)(int)local_80;
              uVar21 = uVar21 & 0xffffffff;
              do {
                if (((int)local_80 < 0) || (p_00->nSize <= lVar17)) {
LAB_00744e5d:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar5 = p_00->pArray[lVar17];
                uVar6 = uVar5 >> 1;
                pbVar15 = local_98;
                if ((int)puVar13[1] <= (int)uVar6) goto LAB_00744ea3;
                uVar14 = *(ulong *)(*(long *)(puVar13 + 2) + (ulong)uVar6 * 8);
                uVar22 = (ulong)(int)__ptr[1];
                uVar6 = *__ptr;
                if (__ptr[1] == uVar6) {
                  if ((int)uVar6 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      local_88 = uVar22;
                      pvVar8 = malloc(0x80);
                    }
                    else {
                      local_88 = uVar22;
                      pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    uVar7 = 0x10;
                  }
                  else {
                    uVar7 = uVar6 * 2;
                    if ((int)uVar7 <= (int)uVar6) goto LAB_00744c9f;
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      local_88 = uVar22;
                      pvVar8 = malloc((ulong)uVar6 << 4);
                    }
                    else {
                      local_88 = uVar22;
                      pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar6 << 4);
                    }
                  }
                  *(void **)(__ptr + 2) = pvVar8;
                  *__ptr = uVar7;
                  puVar13 = local_90;
                  uVar22 = local_88;
                  p_00 = local_60;
                }
LAB_00744c9f:
                __ptr[1] = (int)uVar22 + 1;
                *(ulong *)(*(long *)(__ptr + 2) + uVar22 * 8) = uVar5 & 1 ^ uVar14;
                lVar17 = lVar17 + 1;
                uVar21 = uVar21 - 1;
                uVar5 = (uint)local_70;
              } while (uVar21 != 0);
            }
            uVar21 = local_80;
            Vec_IntFree(p_00);
          }
          if (0 < (int)uVar5) {
            uVar14 = uVar21 & 0xffffffff;
            uVar22 = (ulong)uVar5;
            do {
              pbVar15 = local_98;
              if (((int)uVar21 < 0) || ((int)__ptr[1] <= (int)uVar14)) goto LAB_00744ea3;
              Aig_ObjCreateCo(local_68,*(Aig_Obj_t **)(*(long *)(__ptr + 2) + uVar14 * 8));
              uVar14 = uVar14 + 1;
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          p = local_68;
          if (0 < (int)uVar21) {
            uVar22 = 0;
            uVar14 = (ulong)__ptr[1];
            if ((int)__ptr[1] < 1) {
              uVar14 = uVar22;
            }
            do {
              pbVar15 = local_98;
              if (uVar14 == uVar22) {
LAB_00744ea3:
                local_98 = pbVar15;
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              Aig_ObjCreateCo(p,*(Aig_Obj_t **)(*(long *)(__ptr + 2) + uVar22 * 8));
              uVar22 = uVar22 + 1;
            } while ((uVar21 & 0xffffffff) != uVar22);
          }
          if (*(void **)(__ptr + 2) != (void *)0x0) {
            free(*(void **)(__ptr + 2));
            __ptr[2] = 0;
            __ptr[3] = 0;
          }
          free(__ptr);
          iVar3 = local_44;
          pbVar20 = pbVar16 + 1;
          local_98 = pbVar16;
          if (((pbVar20 < local_50 + local_3c) && (*pbVar16 == 99)) &&
             (local_98 = pbVar20, *pbVar20 == 0x6e)) {
            pbVar16 = pbVar16 + 2;
            local_98 = pbVar16;
            if (p->pName != (char *)0x0) {
              free(p->pName);
              p->pName = (char *)0x0;
            }
            pcVar18 = Abc_UtilStrsav((char *)pbVar16);
            p->pName = pcVar18;
          }
          if (*(void **)(local_90 + 2) != (void *)0x0) {
            free(*(void **)(local_90 + 2));
            local_90[2] = 0;
            local_90[3] = 0;
          }
          bVar23 = local_48 == 0;
          free(local_90);
          Aig_ManCleanup(p);
          Aig_ManSetRegNum(p,p->nRegs);
          if ((~(byte)local_54 & bVar23) == 0) {
            Aig_ManInvertConstraints(p);
          }
          if (iVar3 != 0) {
            iVar3 = Aig_ManCheck(p);
            if (iVar3 == 0) {
              puts("Ioa_ReadAiger: The network check has failed.");
              Aig_ManStop(p);
              return (Aig_Man_t *)0x0;
            }
            return p;
          }
          return p;
        }
        pcVar18 = "Reading AIGER files with liveness properties are currently not supported.\n";
        __size = 0x4a;
      }
      else {
        pcVar18 = "The number of objects does not match.\n";
        __size = 0x26;
      }
    }
    else {
      pcVar18 = "The parameter line is in a wrong format.\n";
      __size = 0x29;
    }
  }
  else {
    pcVar18 = "Wrong input file format.\n";
    __size = 0x19;
  }
  fwrite(pcVar18,__size,1,_stdout);
  return (Aig_Man_t *)0x0;
code_r0x00744393:
  pbVar20 = pbVar20 + 1;
  goto LAB_00744385;
}

Assistant:

Aig_Man_t * Ioa_ReadAigerFromMemory( char * pContents, int nFileSize, int fCheck )
{
    Vec_Int_t * vLits = NULL;
    Vec_Ptr_t * vNodes, * vDrivers;//, * vTerms;
    Aig_Obj_t * pObj, * pNode0, * pNode1;
    Aig_Man_t * pNew;
    int nTotal, nInputs, nOutputs, nLatches, nAnds, i;//, iTerm, nDigits;
    int nBad = 0, nConstr = 0, nJust = 0, nFair = 0;
    char * pDrivers, * pSymbols, * pCur;//, * pType;
    unsigned uLit0, uLit1, uLit;

    // check if the input file format is correct
    if ( strncmp(pContents, "aig", 3) != 0 || (pContents[3] != ' ' && pContents[3] != '2') )
    {
        fprintf( stdout, "Wrong input file format.\n" );
        return NULL;
    }

    // read the parameters (M I L O A + B C J F)
    pCur = pContents;         while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of objects
    nTotal = atoi( pCur );    while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
    if ( *pCur == ' ' )
    {
        assert( nOutputs == 0 );
        // read the number of properties
        pCur++;
        nBad = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nBad;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nConstr = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nConstr;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nJust = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nJust;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nFair = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nFair;
    }
    if ( *pCur != '\n' )
    {
        fprintf( stdout, "The parameter line is in a wrong format.\n" );
        return NULL;
    }
    pCur++;

    // check the parameters
    if ( nTotal != nInputs + nLatches + nAnds )
    {
        fprintf( stdout, "The number of objects does not match.\n" );
        return NULL;
    }
    if ( nJust || nFair )
    {
        fprintf( stdout, "Reading AIGER files with liveness properties are currently not supported.\n" );
        return NULL;
    }

    if ( nConstr )
    {
        if ( nConstr == 1 )
            fprintf( stdout, "Warning: The last output is interpreted as a constraint.\n" );
        else
            fprintf( stdout, "Warning: The last %d outputs are interpreted as constraints.\n", nConstr );
    }

    // allocate the empty AIG
    pNew = Aig_ManStart( nAnds );
    pNew->nConstrs = nConstr;

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Aig_ManConst0(pNew) );

    // create the PIs
    for ( i = 0; i < nInputs + nLatches; i++ )
    {
        pObj = Aig_ObjCreateCi(pNew);    
        Vec_PtrPush( vNodes, pObj );
    }
/*
    // create the POs
    for ( i = 0; i < nOutputs + nLatches; i++ )
    {
        pObj = Aig_ObjCreateCo(pNew);   
    }
*/
    // create the latches
    pNew->nRegs = nLatches;
/*
    nDigits = Ioa_Base10Log( nLatches );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Aig_ObjCreateLatch(pNew);
        Aig_LatchSetInit0( pObj );
        pNode0 = Aig_ObjCreateBi(pNew);
        pNode1 = Aig_ObjCreateBo(pNew);
        Aig_ObjAddFanin( pObj, pNode0 );
        Aig_ObjAddFanin( pNode1, pObj );
        Vec_PtrPush( vNodes, pNode1 );
        // assign names to latch and its input
//        Aig_ObjAssignName( pObj, Aig_ObjNameDummy("_L", i, nDigits), NULL );
//        printf( "Creating latch %s with input %d and output %d.\n", Aig_ObjName(pObj), pNode0->Id, pNode1->Id );
    } 
*/ 

    // remember the beginning of latch/PO literals
    pDrivers = pCur;
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        // scroll to the beginning of the binary data
        for ( i = 0; i < nLatches + nOutputs; )
            if ( *pCur++ == '\n' )
                i++;
    }
    else // modified AIGER
    {
        vLits = Ioa_WriteDecodeLiterals( &pCur, nLatches + nOutputs );
    }

    // create the AND gates
//    pProgress = Bar_ProgressStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        uLit = ((i + 1 + nInputs + nLatches) << 1);
        uLit1 = uLit  - Ioa_ReadAigerDecode( &pCur );
        uLit0 = uLit1 - Ioa_ReadAigerDecode( &pCur );
//        assert( uLit1 > uLit0 );
        pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), uLit0 & 1 );
        pNode1 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit1 >> 1), uLit1 & 1 );
        assert( Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches );
        Vec_PtrPush( vNodes, Aig_And(pNew, pNode0, pNode1) );
    }
//    Bar_ProgressStop( pProgress );

    // remember the place where symbols begin
    pSymbols = pCur;

    // read the latch driver literals
    vDrivers = Vec_PtrAlloc( nLatches + nOutputs );
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        pCur = pDrivers;
        for ( i = 0; i < nLatches; i++ )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        // read the PO driver literals
        for ( i = 0; i < nOutputs; i++ )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }

    }
    else
    {
        // read the latch driver literals
        for ( i = 0; i < nLatches; i++ )
        {
            uLit0 = Vec_IntEntry( vLits, i );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        // read the PO driver literals
        for ( i = 0; i < nOutputs; i++ )
        {
            uLit0 = Vec_IntEntry( vLits, i+nLatches );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        Vec_IntFree( vLits );
    }

    // create the POs
    for ( i = 0; i < nOutputs; i++ )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vDrivers, nLatches + i) );
    for ( i = 0; i < nLatches; i++ )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vDrivers, i) );
    Vec_PtrFree( vDrivers );

/*
    // read the names if present
    pCur = pSymbols;
    if ( *pCur != 'c' )
    {
        int Counter = 0;
        while ( pCur < pContents + nFileSize && *pCur != 'c' )
        {
            // get the terminal type
            pType = pCur;
            if ( *pCur == 'i' )
                vTerms = pNew->vPis;
            else if ( *pCur == 'l' )
                vTerms = pNew->vBoxes;
            else if ( *pCur == 'o' )
                vTerms = pNew->vPos;
            else
            {
                fprintf( stdout, "Wrong terminal type.\n" );
                return NULL;
            }
            // get the terminal number
            iTerm = atoi( ++pCur );  while ( *pCur++ != ' ' );
            // get the node
            if ( iTerm >= Vec_PtrSize(vTerms) )
            {
                fprintf( stdout, "The number of terminal is out of bound.\n" );
                return NULL;
            }
            pObj = Vec_PtrEntry( vTerms, iTerm );
            if ( *pType == 'l' )
                pObj = Aig_ObjFanout0(pObj);
            // assign the name
            pName = pCur;          while ( *pCur++ != '\n' );
            // assign this name 
            *(pCur-1) = 0;
            Aig_ObjAssignName( pObj, pName, NULL );
            if ( *pType == 'l' )
            {
                Aig_ObjAssignName( Aig_ObjFanin0(pObj), Aig_ObjName(pObj), "L" );
                Aig_ObjAssignName( Aig_ObjFanin0(Aig_ObjFanin0(pObj)), Aig_ObjName(pObj), "_in" );
            }
            // mark the node as named
            pObj->pCopy = (Aig_Obj_t *)Aig_ObjName(pObj);
        } 

        // assign the remaining names
        Aig_ManForEachCi( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Counter++;
        }
        Aig_ManForEachLatchOutput( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Aig_ObjAssignName( Aig_ObjFanin0(pObj), Aig_ObjName(pObj), "L" );
            Aig_ObjAssignName( Aig_ObjFanin0(Aig_ObjFanin0(pObj)), Aig_ObjName(pObj), "_in" );
            Counter++;
        }
        Aig_ManForEachCo( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Counter++;
        }
        if ( Counter )
            printf( "Ioa_ReadAiger(): Added %d default names for nameless I/O/register objects.\n", Counter );
    }
    else
    {
//        printf( "Ioa_ReadAiger(): I/O/register names are not given. Generating short names.\n" );
        Aig_ManShortNames( pNew );
    }
*/
    pCur = pSymbols;
    if ( pCur + 1 < pContents + nFileSize && *pCur == 'c' )
    {
        pCur++;
        if ( *pCur == 'n' )
        {
            pCur++;
            // read model name
            ABC_FREE( pNew->pName );
            pNew->pName = Abc_UtilStrsav( pCur );
        }
    }

    // skipping the comments
    Vec_PtrFree( vNodes );

    // remove the extra nodes
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pNew) );

    // update polarity of the additional outputs
    if ( nBad || nConstr || nJust || nFair )
        Aig_ManInvertConstraints( pNew );

    // check the result
    if ( fCheck && !Aig_ManCheck( pNew ) )
    {
        printf( "Ioa_ReadAiger: The network check has failed.\n" );
        Aig_ManStop( pNew );
        return NULL;
    }
    return pNew;
}